

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcStatesStatesFixedScaling
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          int *states2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  double *pdVar9;
  int local_54;
  
  iVar2 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  if (0 < iVar2) {
    iVar3 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
    iVar7 = 0;
    local_54 = startPattern * 4;
    do {
      if (startPattern < endPattern) {
        pdVar9 = destP + (long)local_54 + 3;
        iVar6 = iVar7 * 0x14;
        lVar8 = (long)startPattern;
        do {
          iVar4 = states1[lVar8];
          iVar5 = states2[lVar8];
          dVar1 = scaleFactors[lVar8];
          lVar8 = lVar8 + 1;
          pdVar9[-3] = (matrices1[iVar4 + iVar6] * matrices2[iVar5 + iVar6]) / dVar1;
          pdVar9[-2] = (matrices1[iVar4 + iVar6 + 5] * matrices2[iVar5 + iVar6 + 5]) / dVar1;
          pdVar9[-1] = (matrices1[iVar4 + iVar6 + 10] * matrices2[iVar5 + iVar6 + 10]) / dVar1;
          *pdVar9 = (matrices1[iVar4 + iVar6 + 0xf] * matrices2[iVar5 + iVar6 + 0xf]) / dVar1;
          pdVar9 = pdVar9 + 4;
        } while (endPattern != lVar8);
      }
      local_54 = local_54 + iVar3 * 4;
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar2);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcStatesStatesFixedScaling(REALTYPE* destP,
                                                                           const int* states1,
                                                                           const REALTYPE* matrices1,
                                                                           const int* states2,
                                                                           const REALTYPE* matrices2,
                                                                           const REALTYPE* scaleFactors,
                                                                           int startPattern,
                                                                           int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          v += 4*startPattern;
        }

        int w = l*4*OFFSET;

        for (int k = startPattern; k < endPattern; k++) {

            const int state1 = states1[k];
            const int state2 = states2[k];
            const REALTYPE scaleFactor = scaleFactors[k];

            destP[v    ] = matrices1[w            + state1] *
                           matrices2[w            + state2] / scaleFactor;
            destP[v + 1] = matrices1[w + OFFSET*1 + state1] *
                           matrices2[w + OFFSET*1 + state2] / scaleFactor;
            destP[v + 2] = matrices1[w + OFFSET*2 + state1] *
                           matrices2[w + OFFSET*2 + state2] / scaleFactor;
            destP[v + 3] = matrices1[w + OFFSET*3 + state1] *
                           matrices2[w + OFFSET*3 + state2] / scaleFactor;
            v += 4;
        }
    }
}